

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O0

void __thiscall BarrierTest_ArriveAndWait_Test::TestBody(BarrierTest_ArriveAndWait_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  AssertHelper local_170;
  Message local_168 [6];
  exception *e_1;
  TrueWithString gtest_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  AssertHelper local_f0;
  Message local_e8 [6];
  exception *e;
  undefined1 auStack_a8 [8];
  TrueWithString gtest_msg;
  undefined1 local_80 [8];
  barrier<yamc::detail::default_barrier_completion> barrier;
  BarrierTest_ArriveAndWait_Test *this_local;
  
  barrier.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)this;
  yamc::barrier<yamc::detail::default_barrier_completion>::barrier
            ((barrier<yamc::detail::default_barrier_completion> *)local_80,1);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_a8 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_a8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_a8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::barrier<yamc::detail::default_barrier_completion>::arrive_and_wait
                ((barrier<yamc::detail::default_barrier_completion> *)local_80);
    }
  }
  else {
    testing::Message::Message(local_e8);
    std::operator+(&local_110,
                   "Expected: barrier.arrive_and_wait() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_a8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    testing::Message::~Message(local_e8);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_a8);
  gtest_msg_1.value._M_string_length = 0;
  gtest_msg_1.value.field_2._M_allocated_capacity = 0;
  e_1 = (exception *)0x0;
  gtest_msg_1.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_1.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_1);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_1);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::barrier<yamc::detail::default_barrier_completion>::arrive_and_wait
                ((barrier<yamc::detail::default_barrier_completion> *)local_80);
    }
  }
  else {
    testing::Message::Message(local_168);
    std::operator+(&local_190,
                   "Expected: barrier.arrive_and_wait() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_1);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    testing::Message::~Message(local_168);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_1);
  yamc::barrier<yamc::detail::default_barrier_completion>::~barrier
            ((barrier<yamc::detail::default_barrier_completion> *)local_80);
  return;
}

Assistant:

TEST(BarrierTest, ArriveAndWait)
{
  yamc::barrier<> barrier{1};
  EXPECT_NO_THROW(barrier.arrive_and_wait());
  EXPECT_NO_THROW(barrier.arrive_and_wait());
}